

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.cpp
# Opt level: O2

int64_t sparse_file_len(sparse_file *s,bool sparse,bool crc)

{
  uint chunks;
  int iVar1;
  output_file *out;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  int64_t count;
  
  chunks = sparse_count_chunks(s);
  count = 0;
  out = output_file_open_callback
                  (out_counter_write,&count,s->block_size,s->len,0,
                   (int)CONCAT71(in_register_00000031,sparse),chunks,
                   (int)CONCAT71(in_register_00000011,crc));
  if (out != (output_file *)0x0) {
    iVar1 = write_all_blocks(s,out);
    output_file_close(out);
    if (-1 < iVar1) {
      return count;
    }
  }
  return -1;
}

Assistant:

int64_t sparse_file_len(struct sparse_file* s, bool sparse, bool crc) {
  int ret;
  int chunks = sparse_count_chunks(s);
  int64_t count = 0;
  struct output_file* out;

  out = output_file_open_callback(out_counter_write, &count, s->block_size, s->len, false, sparse,
                                  chunks, crc);
  if (!out) {
    return -1;
  }

  ret = write_all_blocks(s, out);

  output_file_close(out);

  if (ret < 0) {
    return -1;
  }

  return count;
}